

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.c
# Opt level: O0

int generate_script_from_miniscript
              (miniscript_node_t *node,miniscript_node_t *parent,uint32_t derive_child_num,
              uchar *script,size_t script_len,size_t *write_len)

{
  int iVar1;
  uint32_t local_6c0;
  int8_t local_6b9;
  uint32_t count;
  int8_t astarisk_index;
  uint32_t bip32_array [256];
  ext_key derive_extkey;
  ext_key extkey;
  uchar bip32_serialized [82];
  uchar local_d8;
  undefined1 auStack_d7 [7];
  uchar pubkey [33];
  uchar local_a8;
  uchar auStack_a7 [7];
  uchar privkey [38];
  miniscript_wrapper_item_t *local_78;
  miniscript_wrapper_item_t *item;
  size_t max;
  size_t table_idx;
  size_t index;
  size_t len;
  size_t output_len;
  size_t *psStack_40;
  int ret;
  size_t *write_len_local;
  size_t script_len_local;
  uchar *script_local;
  miniscript_node_t *pmStack_20;
  uint32_t derive_child_num_local;
  miniscript_node_t *parent_local;
  miniscript_node_t *node_local;
  
  len = 0;
  psStack_40 = write_len;
  write_len_local = (size_t *)script_len;
  script_len_local = (size_t)script;
  script_local._4_4_ = derive_child_num;
  pmStack_20 = parent;
  parent_local = node;
  if (node->info == (miniscript_item_t *)0x0) {
    if (((node->kind & 4U) == 0) && (node->kind != 0x1020)) {
      if (node->kind == 8) {
        output_len._4_4_ =
             generate_script_from_number(node->number,parent,script,script_len,write_len);
      }
      else if ((node->kind == 0x110) || (node->kind == 0x210)) {
        output_len._4_4_ =
             analyze_miniscript_addr
                       (node->data,(miniscript_node_t *)0x0,(miniscript_node_t *)0x0,
                        (address_script_t *)0x0,script,script_len,write_len);
      }
      else if (node->kind == 0x2020) {
        if (script_len < 0x41) {
          return -2;
        }
        output_len._4_4_ = wally_base58_to_bytes(node->data,1,&local_a8,0x26,&len);
        if ((output_len._4_4_ == 0) && (len < 0x21)) {
          return -2;
        }
        output_len._4_4_ = wally_ec_public_key_from_private_key(auStack_a7,0x20,&local_d8,0x21);
        if (output_len._4_4_ == 0) {
          if (local_a8 == 0x80) {
            if ((parent_local->network_type != 0) && (parent_local->network_type != 1)) {
              return -2;
            }
            parent_local->network_type = 1;
          }
          else {
            if ((parent_local->network_type != 0) && (parent_local->network_type != 2)) {
              return -2;
            }
            parent_local->network_type = 2;
          }
        }
        if (output_len._4_4_ == 0) {
          if ((len == 0x22) && (privkey[0x19] == '\x01')) {
            if ((parent_local->is_xonly_key & 1U) == 0) {
              memcpy((void *)script_len_local,&local_d8,0x21);
              *psStack_40 = 0x21;
            }
            else {
              *(undefined8 *)script_len_local = _auStack_d7;
              *(undefined8 *)(script_len_local + 8) = pubkey._1_8_;
              *(undefined8 *)(script_len_local + 0x10) = pubkey._9_8_;
              *(undefined8 *)(script_len_local + 0x18) = pubkey._17_8_;
              *psStack_40 = 0x20;
            }
          }
          else {
            output_len._4_4_ =
                 wally_ec_public_key_decompress(&local_d8,0x21,(uchar *)script_len_local,0x41);
            if (output_len._4_4_ == 0) {
              *psStack_40 = 0x41;
              parent_local->is_uncompress_key = true;
            }
          }
        }
      }
      else {
        if ((node->kind & 0x4020U) != 0x4020) {
          return -2;
        }
        local_6b9 = -1;
        local_6c0 = 0;
        wally_bzero(derive_extkey.pub_key_tweak_sum + 0x18,0xc0);
        wally_bzero(bip32_array + 0xfe,0xc0);
        output_len._4_4_ =
             wally_base58_to_bytes(parent_local->data,1,extkey.pub_key_tweak_sum + 0x18,0x52,&len);
        if (output_len._4_4_ != 0) {
          return output_len._4_4_;
        }
        if (0x52 < len) {
          return -2;
        }
        output_len._4_4_ =
             bip32_key_unserialize
                       (extkey.pub_key_tweak_sum + 0x18,len,
                        (ext_key *)(derive_extkey.pub_key_tweak_sum + 0x18));
        if (output_len._4_4_ != 0) {
          return output_len._4_4_;
        }
        if (((parent_local->kind == 0x14020) && (extkey.hash160._12_4_ == 0x488ade4)) ||
           ((parent_local->kind != 0x14020 && (extkey.hash160._12_4_ == 0x488b21e)))) {
          if ((parent_local->network_type != 0) && (parent_local->network_type != 1)) {
            return -2;
          }
          parent_local->network_type = 1;
        }
        else {
          if ((parent_local->network_type != 0) && (parent_local->network_type != 2)) {
            return -2;
          }
          parent_local->network_type = 2;
        }
        iVar1 = 0;
        if ((parent_local->derive_path != (char *)0x0) && (*parent_local->derive_path != '\0')) {
          output_len._4_4_ =
               convert_bip32_path_to_array
                         (parent_local->derive_path,&count,0x100,parent_local->kind == 0x14020,
                          &local_6c0,&local_6b9);
          if (output_len._4_4_ != 0) {
            return output_len._4_4_;
          }
          if (-1 < local_6b9) {
            (&count)[local_6b9] = script_local._4_4_ | (&count)[local_6b9];
          }
          output_len._4_4_ =
               bip32_key_from_parent_path
                         ((ext_key *)(derive_extkey.pub_key_tweak_sum + 0x18),&count,
                          (ulong)local_6c0,1,(ext_key *)(bip32_array + 0xfe));
          if (output_len._4_4_ != 0) {
            return output_len._4_4_;
          }
          memcpy(derive_extkey.pub_key_tweak_sum + 0x18,bip32_array + 0xfe,0xc0);
          iVar1 = output_len._4_4_;
        }
        output_len._4_4_ = iVar1;
        if ((parent_local->is_xonly_key & 1U) == 0) {
          memcpy((void *)script_len_local,extkey.hash160 + 0x13,0x21);
          *psStack_40 = 0x21;
        }
        else {
          *(undefined8 *)script_len_local = extkey._120_8_;
          *(undefined8 *)(script_len_local + 8) = extkey.pub_key._1_8_;
          *(undefined8 *)(script_len_local + 0x10) = extkey.pub_key._9_8_;
          *(undefined8 *)(script_len_local + 0x18) = extkey.pub_key._17_8_;
          *psStack_40 = 0x20;
        }
      }
    }
    else {
      output_len._4_4_ = wally_hex_to_bytes(node->data,script,script_len,write_len);
      if ((output_len._4_4_ == 0) && (parent_local->kind == 0x1020)) {
        if (*psStack_40 == 0x41) {
          parent_local->is_uncompress_key = true;
        }
        else if (*psStack_40 == 0x20) {
          parent_local->is_xonly_key = true;
        }
      }
    }
    return output_len._4_4_;
  }
  len = *write_len;
  output_len._4_4_ =
       (*node->info->generate_function)(node,parent,derive_child_num,script,script_len,&len);
  if (output_len._4_4_ != 0) {
    return output_len._4_4_;
  }
  if (parent_local->wrapper != 0) {
    for (table_idx = strlen(parent_local->wrapper_str); table_idx != 0; table_idx = table_idx - 1) {
      local_78 = (miniscript_wrapper_item_t *)0x0;
      for (max = 0; max < 10; max = max + 1) {
        if (*miniscript_wrapper_table[max].name == parent_local->wrapper_str[table_idx - 1]) {
          local_78 = miniscript_wrapper_table + max;
          break;
        }
      }
      if (local_78 == (miniscript_wrapper_item_t *)0x0) {
        return -2;
      }
      iVar1 = (*local_78->generate_function)((uchar *)script_len_local,(size_t)write_len_local,&len)
      ;
      if (iVar1 != 0) {
        return iVar1;
      }
      output_len._4_4_ = 0;
    }
  }
  *psStack_40 = len;
  return output_len._4_4_;
}

Assistant:

static int generate_script_from_miniscript(
    struct miniscript_node_t *node,
    struct miniscript_node_t *parent,
    uint32_t derive_child_num,
    unsigned char *script,
    size_t script_len,
    size_t *write_len)
{
    int ret;
    size_t output_len = 0;
    size_t len;
    size_t index;
    size_t table_idx;
    size_t max;
    const struct miniscript_wrapper_item_t *item = NULL;

    if (node->info) {
        output_len = *write_len;
        ret = node->info->generate_function(node, parent, derive_child_num, script,
                                            script_len, &output_len);
        if (ret != WALLY_OK)
            return ret;

        if (node->wrapper != 0) {
            /* back from wrapper string */
            max = sizeof(miniscript_wrapper_table) / sizeof(struct miniscript_item_t);
            len = strlen(node->wrapper_str);
            for (index = len; index > 0; --index) {
                item = NULL;
                for (table_idx = 0; table_idx < max; ++table_idx) {
                    if (miniscript_wrapper_table[table_idx].name[0] == node->wrapper_str[index - 1]) {
                        item = &miniscript_wrapper_table[table_idx];
                        break;
                    }
                }
                if (!item) {
                    return WALLY_EINVAL;
                }

                ret = item->generate_function(script, script_len, &output_len);
                if (ret != WALLY_OK)
                    return ret;
            }
        }
        *write_len = output_len;
        return ret;
    }

    /* value data */
    if ((node->kind & DESCRIPTOR_KIND_RAW) || (node->kind == DESCRIPTOR_KIND_PUBLIC_KEY)) {
        ret = wally_hex_to_bytes(node->data, script, script_len, write_len);
        if (((ret == WALLY_OK)) && (node->kind == DESCRIPTOR_KIND_PUBLIC_KEY)) {
            if (*write_len == EC_PUBLIC_KEY_UNCOMPRESSED_LEN)
                node->is_uncompress_key = true;
            else if (*write_len == XONLY_PUBLIC_KEY_LEN)
                node->is_xonly_key = true;
        }
    } else if (node->kind == DESCRIPTOR_KIND_NUMBER) {
        ret = generate_script_from_number(node->number, parent, script, script_len, write_len);
    } else if ((node->kind == DESCRIPTOR_KIND_BASE58) || (node->kind == DESCRIPTOR_KIND_BECH32)) {
        ret = analyze_miniscript_addr(node->data, NULL, NULL, NULL, script, script_len, write_len);
    } else if (node->kind == DESCRIPTOR_KIND_PRIVATE_KEY) {
        unsigned char privkey[2 + EC_PRIVATE_KEY_LEN + BASE58_CHECKSUM_LEN];
        unsigned char pubkey[EC_PUBLIC_KEY_LEN];
        if (script_len < EC_PUBLIC_KEY_UNCOMPRESSED_LEN)
            return WALLY_EINVAL;

        ret = wally_base58_to_bytes(node->data, BASE58_FLAG_CHECKSUM, privkey,
                                    sizeof(privkey), &output_len);
        if ((ret == WALLY_OK) && (output_len < EC_PRIVATE_KEY_LEN + 1))
            return WALLY_EINVAL;

        ret = wally_ec_public_key_from_private_key(&privkey[1], EC_PRIVATE_KEY_LEN,
                                                   pubkey, sizeof(pubkey));
        if (ret == WALLY_OK) {
            if (privkey[0] == WALLY_ADDRESS_VERSION_WIF_MAINNET) {
                if ((node->network_type != 0) && (node->network_type != WALLY_NETWORK_BITCOIN_MAINNET))
                    return WALLY_EINVAL;
                node->network_type = WALLY_NETWORK_BITCOIN_MAINNET;
            } else {
                if ((node->network_type != 0) && (node->network_type != WALLY_NETWORK_BITCOIN_TESTNET))
                    return WALLY_EINVAL;
                node->network_type = WALLY_NETWORK_BITCOIN_TESTNET;
            }
        }
        if (ret == WALLY_OK) {
            if ((output_len == EC_PRIVATE_KEY_LEN + 2) && (privkey[EC_PRIVATE_KEY_LEN + 1] == 1)) {
                if (node->is_xonly_key) {
                    memcpy(script, &pubkey[1], XONLY_PUBLIC_KEY_LEN);
                    *write_len = XONLY_PUBLIC_KEY_LEN;
                } else {
                    memcpy(script, pubkey, EC_PUBLIC_KEY_LEN);
                    *write_len = EC_PUBLIC_KEY_LEN;
                }
            } else {
                ret = wally_ec_public_key_decompress(pubkey, sizeof(pubkey), script,
                                                     EC_PUBLIC_KEY_UNCOMPRESSED_LEN);
                if (ret == WALLY_OK) {
                    *write_len = EC_PUBLIC_KEY_UNCOMPRESSED_LEN;
                    node->is_uncompress_key = true;
                }
            }
        }
    } else if ((node->kind & DESCRIPTOR_KIND_BIP32) == DESCRIPTOR_KIND_BIP32) {
        unsigned char bip32_serialized[BIP32_SERIALIZED_LEN + BASE58_CHECKSUM_LEN];
        struct ext_key extkey;
        struct ext_key derive_extkey;
        uint32_t bip32_array[DESCRIPTOR_BIP32_PATH_NUM_MAX];
        int8_t astarisk_index = -1;
        uint32_t count = 0;

        wally_bzero(&extkey, sizeof(struct ext_key));
        wally_bzero(&derive_extkey, sizeof(struct ext_key));
        ret = wally_base58_to_bytes(node->data, BASE58_FLAG_CHECKSUM,
                                    bip32_serialized, sizeof(bip32_serialized), &output_len);
        if (ret != WALLY_OK)
            return ret;
        if (output_len > sizeof(bip32_serialized))
            return WALLY_EINVAL;

        ret = bip32_key_unserialize(bip32_serialized, output_len, &extkey);
        if (ret != WALLY_OK)
            return ret;

        if (((node->kind == DESCRIPTOR_KIND_BIP32_PRIVATE_KEY) && (extkey.version == BIP32_VER_MAIN_PRIVATE)) ||
            ((node->kind != DESCRIPTOR_KIND_BIP32_PRIVATE_KEY) && (extkey.version == BIP32_VER_MAIN_PUBLIC))) {
            if (node->network_type != 0 && node->network_type != WALLY_NETWORK_BITCOIN_MAINNET) {
                return WALLY_EINVAL;
            }
            node->network_type = WALLY_NETWORK_BITCOIN_MAINNET;
        } else {
            if (node->network_type != 0 && node->network_type != WALLY_NETWORK_BITCOIN_TESTNET) {
                return WALLY_EINVAL;
            }
            node->network_type = WALLY_NETWORK_BITCOIN_TESTNET;
        }

        if (node->derive_path && node->derive_path[0] != '\0') {
            ret = convert_bip32_path_to_array(node->derive_path, bip32_array,
                                              DESCRIPTOR_BIP32_PATH_NUM_MAX,
                                              (node->kind == DESCRIPTOR_KIND_BIP32_PRIVATE_KEY),
                                              &count, &astarisk_index);
            if (ret != WALLY_OK)
                return ret;

            if (astarisk_index >= 0)
                bip32_array[astarisk_index] |= derive_child_num;

            ret = bip32_key_from_parent_path(&extkey, bip32_array, count,
                                             BIP32_FLAG_KEY_PUBLIC, &derive_extkey);
            if (ret != WALLY_OK)
                return ret;

            memcpy(&extkey, &derive_extkey, sizeof(extkey));
        }
        if (node->is_xonly_key) {
            memcpy(script, &extkey.pub_key[1], XONLY_PUBLIC_KEY_LEN);
            *write_len = XONLY_PUBLIC_KEY_LEN;
        } else {
            memcpy(script, extkey.pub_key, EC_PUBLIC_KEY_LEN);
            *write_len = EC_PUBLIC_KEY_LEN;
        }
    } else {
        return WALLY_EINVAL;
    }

    return ret;
}